

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islower.c
# Opt level: O1

int main(void)

{
  ushort **ppuVar1;
  
  ppuVar1 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar1 + 0xc3) & 2) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1a,"islower( \'a\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0xf5) & 2) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1b,"islower( \'z\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x83) & 2) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1c,"! islower( \'A\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0xb5) & 2) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1d,"! islower( \'Z\' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x41) & 2) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1e,"! islower( \' \' )");
  }
  if ((*(byte *)((long)*ppuVar1 + 0x81) & 2) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/islower.c, line %d - %s\n"
           ,0x1f,"! islower( \'@\' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( islower( 'a' ) );
    TESTCASE( islower( 'z' ) );
    TESTCASE( ! islower( 'A' ) );
    TESTCASE( ! islower( 'Z' ) );
    TESTCASE( ! islower( ' ' ) );
    TESTCASE( ! islower( '@' ) );
    return TEST_RESULTS;
}